

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

AttributeInstanceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AttributeInstanceSyntax,slang::syntax::AttributeInstanceSyntax_const&>
          (BumpAllocator *this,AttributeInstanceSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  AttributeInstanceSyntax *pAVar13;
  
  pAVar13 = (AttributeInstanceSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AttributeInstanceSyntax *)this->endPtr < pAVar13 + 1) {
    pAVar13 = (AttributeInstanceSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pAVar13 + 1);
  }
  (pAVar13->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pAVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pAVar13->super_SyntaxNode).field_0x4 = uVar5;
  (pAVar13->super_SyntaxNode).parent = pSVar1;
  uVar6 = (args->openParen).field_0x2;
  NVar7.raw = (args->openParen).numFlags.raw;
  uVar8 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  TVar9 = (args->openStar).kind;
  uVar10 = (args->openStar).field_0x2;
  NVar11.raw = (args->openStar).numFlags.raw;
  uVar12 = (args->openStar).rawLen;
  pIVar3 = (args->openStar).info;
  (pAVar13->openParen).kind = (args->openParen).kind;
  (pAVar13->openParen).field_0x2 = uVar6;
  (pAVar13->openParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pAVar13->openParen).rawLen = uVar8;
  (pAVar13->openParen).info = pIVar2;
  (pAVar13->openStar).kind = TVar9;
  (pAVar13->openStar).field_0x2 = uVar10;
  (pAVar13->openStar).numFlags = (NumericTokenFlags)NVar11.raw;
  (pAVar13->openStar).rawLen = uVar12;
  (pAVar13->openStar).info = pIVar3;
  (pAVar13->specs).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->specs).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->specs).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->specs).super_SyntaxListBase.super_SyntaxNode.parent;
  (pAVar13->specs).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->specs).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pAVar13->specs).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pAVar13->specs).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pAVar13->specs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e5cf8;
  (pAVar13->specs).super_SyntaxListBase.childCount = (args->specs).super_SyntaxListBase.childCount;
  (pAVar13->specs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e5fa8;
  sVar4 = (args->specs).elements._M_extent._M_extent_value;
  (pAVar13->specs).elements._M_ptr = (args->specs).elements._M_ptr;
  (pAVar13->specs).elements._M_extent._M_extent_value = sVar4;
  uVar6 = (args->closeStar).field_0x2;
  NVar7.raw = (args->closeStar).numFlags.raw;
  uVar8 = (args->closeStar).rawLen;
  pIVar2 = (args->closeStar).info;
  TVar9 = (args->closeParen).kind;
  uVar10 = (args->closeParen).field_0x2;
  NVar11.raw = (args->closeParen).numFlags.raw;
  uVar12 = (args->closeParen).rawLen;
  pIVar3 = (args->closeParen).info;
  (pAVar13->closeStar).kind = (args->closeStar).kind;
  (pAVar13->closeStar).field_0x2 = uVar6;
  (pAVar13->closeStar).numFlags = (NumericTokenFlags)NVar7.raw;
  (pAVar13->closeStar).rawLen = uVar8;
  (pAVar13->closeStar).info = pIVar2;
  (pAVar13->closeParen).kind = TVar9;
  (pAVar13->closeParen).field_0x2 = uVar10;
  (pAVar13->closeParen).numFlags = (NumericTokenFlags)NVar11.raw;
  (pAVar13->closeParen).rawLen = uVar12;
  (pAVar13->closeParen).info = pIVar3;
  return pAVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }